

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void roundFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  char *z;
  char *zBuf;
  double r;
  sqlite3_value **ppsStack_20;
  int n;
  sqlite3_value **argv_local;
  sqlite3_context *psStack_10;
  int argc_local;
  sqlite3_context *context_local;
  
  r._4_4_ = 0;
  ppsStack_20 = argv;
  argv_local._4_4_ = argc;
  psStack_10 = context;
  if (argc == 2) {
    iVar1 = sqlite3_value_type(argv[1]);
    if (iVar1 == 5) {
      return;
    }
    r._4_4_ = sqlite3_value_int(ppsStack_20[1]);
    if (0x1e < (int)r._4_4_) {
      r._4_4_ = 0x1e;
    }
    if ((int)r._4_4_ < 0) {
      r._4_4_ = 0;
    }
  }
  iVar1 = sqlite3_value_type(*ppsStack_20);
  if (iVar1 != 5) {
    zBuf = (char *)sqlite3_value_double(*ppsStack_20);
    if ((-4503599627370496.0 <= (double)zBuf) && ((double)zBuf <= 4503599627370496.0)) {
      if (r._4_4_ == 0) {
        zBuf = (char *)(double)(long)((double)zBuf +
                                     (double)(~-(ulong)((double)zBuf < 0.0) & 0x3fe0000000000000 |
                                             (ulong)((uint)(-(ulong)((double)zBuf < 0.0) >> 0x20) &
                                                    0xbfe00000) << 0x20));
      }
      else {
        z = sqlite3_mprintf("%.*f",zBuf,(ulong)r._4_4_);
        if (z == (char *)0x0) {
          sqlite3_result_error_nomem(psStack_10);
          return;
        }
        iVar1 = sqlite3Strlen30(z);
        sqlite3AtoF(z,(double *)&zBuf,iVar1,'\x01');
        sqlite3_free(z);
      }
    }
    sqlite3_result_double(psStack_10,(double)zBuf);
  }
  return;
}

Assistant:

static void roundFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  int n = 0;
  double r;
  char *zBuf;
  assert( argc==1 || argc==2 );
  if( argc==2 ){
    if( SQLITE_NULL==sqlite3_value_type(argv[1]) ) return;
    n = sqlite3_value_int(argv[1]);
    if( n>30 ) n = 30;
    if( n<0 ) n = 0;
  }
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  r = sqlite3_value_double(argv[0]);
  /* If Y==0 and X will fit in a 64-bit int,
  ** handle the rounding directly,
  ** otherwise use printf.
  */
  if( r<-4503599627370496.0 || r>+4503599627370496.0 ){
    /* The value has no fractional part so there is nothing to round */
  }else if( n==0 ){
    r = (double)((sqlite_int64)(r+(r<0?-0.5:+0.5)));
  }else{
    zBuf = sqlite3_mprintf("%.*f",n,r);
    if( zBuf==0 ){
      sqlite3_result_error_nomem(context);
      return;
    }
    sqlite3AtoF(zBuf, &r, sqlite3Strlen30(zBuf), SQLITE_UTF8);
    sqlite3_free(zBuf);
  }
  sqlite3_result_double(context, r);
}